

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandQbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_44;
  uint local_40;
  int fVerbose;
  int fDumpCnf;
  int nIters;
  int nPars;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fDumpCnf = -1;
  fVerbose = 500;
  local_40 = 0;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_0027d6d3:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"PIdvh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsComb(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"Works only for combinational networks.\n");
        return 1;
      }
      iVar1 = Abc_NtkPoNum(pAVar2);
      if (iVar1 != 1) {
        Abc_Print(-1,"The miter should have one primary output.\n");
        return 1;
      }
      if ((0 < fDumpCnf) && (iVar1 = Abc_NtkPiNum(pAVar2), fDumpCnf < iVar1)) {
        iVar1 = Abc_NtkIsStrash(pAVar2);
        if (iVar1 == 0) {
          pAVar2 = Abc_NtkStrash(pAVar2,0,1,0);
          Abc_NtkQbf(pAVar2,fDumpCnf,fVerbose,local_40,local_44);
          Abc_NtkDelete(pAVar2);
        }
        else {
          Abc_NtkQbf(pAVar2,fDumpCnf,fVerbose,local_40,local_44);
        }
        return 0;
      }
      Abc_Print(-1,"The number of parameter variables is invalid (should be > 0 and < PI num).\n");
      return 1;
    }
    switch(iVar1) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_0027d92b;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    default:
      goto LAB_0027d92b;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_0027d92b;
      }
      fDumpCnf = atoi(argv[globalUtilOptind]);
      iVar1 = fDumpCnf;
      break;
    case 100:
      local_40 = local_40 ^ 1;
      goto LAB_0027d6d3;
    case 0x68:
      goto LAB_0027d92b;
    case 0x76:
      local_44 = local_44 ^ 1;
      goto LAB_0027d6d3;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0027d92b:
      Abc_Print(-2,"usage: qbf [-PI num] [-dvh]\n");
      Abc_Print(-2,"\t         solves QBF problem EpVxM(p,x)\n");
      Abc_Print(-2,"\t-P num : number of parameters p (should be the first PIs) [default = %d]\n",
                (ulong)(uint)fDumpCnf);
      Abc_Print(-2,"\t-I num : quit after the given iteration even if unsolved [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar3 = "no";
      if (local_40 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (local_44 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandQbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nPars;
    int nIters;
    int fDumpCnf;
    int fVerbose;

    extern void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nIters, int fDumpCnf, int fVerbose );
    // set defaults
    nPars    =  -1;
    nIters   = 500;
    fDumpCnf =   0;
    fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PIdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPars < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIters < 0 )
                goto usage;
            break;
        case 'd':
            fDumpCnf ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "Works only for combinational networks.\n" );
        return 1;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "The miter should have one primary output.\n" );
        return 1;
    }
    if ( !(nPars > 0 && nPars < Abc_NtkPiNum(pNtk)) )
    {
        Abc_Print( -1, "The number of parameter variables is invalid (should be > 0 and < PI num).\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_NtkQbf( pNtk, nPars, nIters, fDumpCnf, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 1, 0 );
        Abc_NtkQbf( pNtk, nPars, nIters, fDumpCnf, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: qbf [-PI num] [-dvh]\n" );
    Abc_Print( -2, "\t         solves QBF problem EpVxM(p,x)\n" );
    Abc_Print( -2, "\t-P num : number of parameters p (should be the first PIs) [default = %d]\n", nPars );
    Abc_Print( -2, "\t-I num : quit after the given iteration even if unsolved [default = %d]\n", nIters );
    Abc_Print( -2, "\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n", fDumpCnf? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}